

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void __thiscall Safaia::Log::Log(Log *this)

{
  int iVar1;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  iVar1 = fileno(_stdout);
  iVar1 = isatty(iVar1);
  this->is_stdout = iVar1;
  std::__cxx11::string::string((string *)&this->str_reset,"\x1b[0m",&local_21);
  std::__cxx11::string::string((string *)&this->str_green,"\x1b[32m",&local_22);
  std::__cxx11::string::string((string *)&this->str_yellow,"\x1b[33m",&local_23);
  std::__cxx11::string::string((string *)&this->str_red,"\x1b[1m\x1b[31m",&local_24);
  this->ansi_color = true;
  this->level = 3;
  return;
}

Assistant:

Log(){
            
        }